

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined8 *puVar2;
  uint uVar3;
  bool bVar4;
  int n;
  uint uVar5;
  ImU32 IVar6;
  long lVar7;
  ImGuiPayload *pIVar8;
  ImGuiPayload *pIVar9;
  uint uVar10;
  char *p;
  byte *buf_00;
  int iVar11;
  char *pcVar12;
  char **ppcVar13;
  float *col_00;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float local_158 [4];
  ImGuiWindow *local_148;
  float local_140;
  float local_13c;
  ulong local_138;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  uint local_11c;
  uint local_118;
  int iStack_114;
  undefined8 uStack_110;
  char *local_100;
  float *local_f8;
  char *local_f0;
  ImGuiWindow *local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_cc;
  undefined1 local_c8 [16];
  ImGuiContext *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ulong local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  char buf [64];
  uint uVar17;
  
  pIVar19 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_12c = GetFrameHeight();
    local_128 = CalcItemWidth();
    local_c8 = ZEXT416(0);
    if ((flags & 0x10U) == 0) {
      local_c8 = ZEXT416((uint)((pIVar19->Style).ItemInnerSpacing.x + local_12c));
    }
    local_f0 = FindRenderedTextEnd(label,(char *)0x0);
    (pIVar19->NextItemData).Flags = 0;
    BeginGroup();
    PushID(label);
    uVar14 = flags & 0xff8ffff7U | 0x100008;
    if ((flags & 0x20U) == 0) {
      uVar14 = flags;
    }
    if ((uVar14 & 8) == 0) {
      ColorEditOptionsPopup(col,uVar14);
    }
    if ((uVar14 & 0x700000) == 0) {
      uVar14 = uVar14 | pIVar19->ColorEditOptions & 0x700000U;
    }
    if ((uVar14 & 0x1800000) == 0) {
      uVar14 = uVar14 | pIVar19->ColorEditOptions & 0x1800000U;
    }
    local_d8 = flags;
    if ((uVar14 & 0x6000000) == 0) {
      uVar14 = uVar14 | pIVar19->ColorEditOptions & 0x6000000U;
    }
    uVar5 = 0;
    if ((uVar14 & 0x18000000) == 0) {
      uVar5 = pIVar19->ColorEditOptions & 0x18000000;
    }
    uVar10 = (uVar14 & 0x700000) - 1;
    if ((uVar14 & 0x700000 ^ uVar10) <= uVar10) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DisplayMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1301,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    local_e8 = pIVar1;
    local_100 = label;
    local_148 = (ImGuiWindow *)CONCAT44(local_148._4_4_,uVar14);
    uVar10 = uVar5 | uVar14;
    uVar5 = uVar5 | uVar14 & 0x18000000;
    uVar14 = uVar5 - 1;
    if ((uVar5 ^ uVar14) <= uVar14) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1302,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    uVar14 = pIVar19->ColorEditOptions & 0xe00fffffU | uVar10;
    local_158._0_8_ = *(undefined8 *)col;
    local_158[2] = col[2];
    if ((uVar14 & 2) == 0) {
      local_158[3] = col[3];
    }
    else {
      local_158[3] = 1.0;
    }
    local_f8 = col;
    local_d0 = uVar10 & 0x10100000;
    local_d4 = ~uVar10;
    if ((uVar10 & 0x10100000) == 0x10100000) {
      ColorConvertHSVtoRGB
                ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                 local_158 + 1,local_158 + 2);
    }
    else if ((~uVar10 & 0x8200000) == 0) {
      ColorConvertRGBtoHSV
                ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                 local_158 + 1,local_158 + 2);
      ColorEditRestoreHS(local_f8,local_158,local_158 + 1,local_158 + 2);
    }
    col_00 = local_f8;
    uVar5 = (uint)(local_158[0] * 255.0 +
                  (float)(-(uint)(0.0 <= local_158[0]) & 0x3f000000 |
                         ~-(uint)(0.0 <= local_158[0]) & 0xbf000000));
    _local_118 = CONCAT44((int)(local_158[1] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[1]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[1]) & 0xbf000000)),uVar5);
    uStack_110 = CONCAT44((int)(local_158[3] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[3]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[3]) & 0xbf000000)),
                          (int)(local_158[2] * 255.0 +
                               (float)(-(uint)(0.0 <= local_158[2]) & 0x3f000000 |
                                      ~-(uint)(0.0 <= local_158[2]) & 0xbf000000)));
    local_a8 = (local_e8->DC).CursorPos;
    IVar21 = local_a8;
    uStack_a0 = 0;
    fVar23 = (float)local_c8._0_4_;
    if ((pIVar19->Style).ColorButtonPosition != 0) {
      fVar23 = 0.0;
    }
    local_140 = local_128 - (float)local_c8._0_4_;
    uVar17 = (uint)((uVar14 & 2) == 0);
    uVar16 = uVar17 + 3;
    (local_e8->DC).CursorPos.x = fVar23 + local_a8.x;
    uVar3 = (uint)local_148;
    local_90 = (ulong)uVar16;
    local_a8 = IVar21;
    if ((((ulong)local_148 & 0x300000) == 0) || ((uVar14 & 0x20) != 0)) {
      local_138 = 0;
      if (((uint)local_148 >> 0x16 & 1) == 0) {
        bVar20 = false;
      }
      else {
        bVar20 = false;
        if ((uVar14 & 0x20) == 0) {
          if (0xfe < (int)uVar5) {
            uVar5 = 0xff;
          }
          uVar18 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar18 = 0;
          }
          if ((uVar14 & 2) == 0) {
            pcVar12 = "#%02X%02X%02X%02X";
          }
          else {
            pcVar12 = "#%02X%02X%02X";
          }
          ImFormatString(buf,0x40,pcVar12,uVar18);
          SetNextItemWidth(local_140);
          bVar20 = false;
          buf_00 = (byte *)buf;
          bVar4 = InputText("##Text",(char *)buf_00,0x40,6,(ImGuiInputTextCallback)0x0,(void *)0x0);
          if (bVar4) {
            while (((ulong)*buf_00 < 0x24 && ((0x900000200U >> ((ulong)*buf_00 & 0x3f) & 1) != 0)))
            {
              buf_00 = buf_00 + 1;
            }
            _local_118 = 0;
            uStack_110 = 0xff00000000;
            if ((uVar14 & 2) == 0) {
              __isoc99_sscanf(buf_00,"%02X%02X%02X%02X",&local_118,&iStack_114,&uStack_110,
                              (long)&uStack_110 + 4);
            }
            else {
              __isoc99_sscanf(buf_00,"%02X%02X%02X",&local_118,&iStack_114,&uStack_110,
                              (long)&uStack_110 + 4);
            }
            bVar20 = true;
          }
          if ((uVar14 & 8) == 0) {
            OpenPopupOnItemClick("context",1);
          }
          local_138 = 0;
        }
      }
    }
    else {
      local_b0 = pIVar19;
      fVar23 = (pIVar19->Style).ItemInnerSpacing.x;
      pcVar12 = "M:0.000";
      if (((uint)local_148 >> 0x18 & 1) == 0) {
        pcVar12 = "M:000";
      }
      uVar18 = 0;
      local_dc = uVar10;
      IVar21 = CalcTextSize(pcVar12,(char *)0x0,false,-1.0);
      bVar20 = (uVar14 >> 0x13 & 1) != 0;
      fVar22 = (float)(uVar17 + 2);
      fVar24 = (float)(int)((local_140 - fVar23 * fVar22) / (float)uVar16);
      local_120 = 1.0;
      if (1.0 <= fVar24) {
        local_120 = fVar24;
      }
      fVar23 = (float)(int)(local_140 - (fVar23 + local_120) * fVar22);
      local_124 = 1.0;
      if (bVar20) {
        local_124 = 0.0;
      }
      local_13c = 1.0;
      if (1.0 <= fVar23) {
        local_13c = fVar23;
      }
      local_cc = 0xff;
      if (bVar20) {
        local_cc = 0;
      }
      iVar11 = ((uVar3 >> 0x15 & 1) != 0) + 1;
      if (local_120 <= IVar21.x) {
        iVar11 = 0;
      }
      ppcVar13 = ColorEdit4::ids;
      uVar15 = 1;
      local_138 = 0;
      bVar20 = false;
      local_11c = uVar14;
      for (; col_00 = local_f8, pIVar19 = local_b0, uVar14 = local_11c, uVar10 = local_dc,
          uVar16 * 4 != uVar18; uVar18 = uVar18 + 4) {
        if (uVar18 != 0) {
          SameLine(0.0,(local_b0->Style).ItemInnerSpacing.x);
        }
        fVar23 = local_120;
        if (uVar16 <= uVar15) {
          fVar23 = local_13c;
        }
        SetNextItemWidth(fVar23);
        lVar7 = (ulong)(uint)(iVar11 << 5) + uVar18 * 2;
        if (((uint)local_148 >> 0x18 & 1) == 0) {
          bVar4 = DragInt(*ppcVar13,(int *)((long)&local_118 + uVar18),1.0,0,local_cc,
                          *(char **)((long)ColorEdit4::fmt_table_int[0] + lVar7),0);
          bVar20 = (bool)(bVar20 | bVar4);
        }
        else {
          bVar4 = DragFloat(*ppcVar13,(float *)((long)local_158 + uVar18),0.003921569,0.0,local_124,
                            *(char **)((long)ColorEdit4::fmt_table_float[0] + lVar7),0);
          bVar20 = (bool)(bVar20 | bVar4);
          local_138 = CONCAT71((int7)(local_138 >> 8),(byte)local_138 | bVar20);
        }
        if ((local_11c & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        ppcVar13 = ppcVar13 + 1;
        uVar15 = uVar15 + 1;
      }
    }
    pcVar12 = local_100;
    if ((uVar14 & 0x10) == 0) {
      fVar23 = 0.0;
      if (((uVar14 & 0x20) == 0) && ((pIVar19->Style).ColorButtonPosition != 0)) {
        fVar23 = local_140 + (pIVar19->Style).ItemInnerSpacing.x;
      }
      (local_e8->DC).CursorPos.x = fVar23 + local_a8.x;
      (local_e8->DC).CursorPos.y = local_a8.y;
      buf._0_8_ = *(undefined8 *)col_00;
      buf._8_4_ = col_00[2];
      if ((uVar14 & 2) == 0) {
        buf._12_4_ = col_00[3];
      }
      else {
        buf._12_4_ = 1.0;
      }
      bVar4 = ColorButton("##ColorButton",(ImVec4 *)buf,uVar14,(ImVec2)0x0);
      if ((uVar14 & 4) == 0 && bVar4) {
        *(undefined8 *)&pIVar19->ColorPickerRef = buf._0_8_;
        (pIVar19->ColorPickerRef).z = (float)buf._8_4_;
        (pIVar19->ColorPickerRef).w = (float)buf._12_4_;
        OpenPopup("picker",0);
        local_80.y = (pIVar19->Style).ItemSpacing.y + (pIVar19->LastItemData).Rect.Max.y;
        local_80.x = (pIVar19->LastItemData).Rect.Min.x + 0.0;
        local_88.x = 0.0;
        local_88.y = 0.0;
        SetNextWindowPos(&local_80,0,&local_88);
      }
      if ((uVar14 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_148 = (ImGuiWindow *)0x0;
      bVar4 = BeginPopup("picker",0);
      if (bVar4) {
        local_148 = pIVar19->CurrentWindow;
        if (local_f0 != pcVar12) {
          TextEx(pcVar12,local_f0,0);
          Spacing();
        }
        uVar5 = local_d8 & 0x1f890002;
        SetNextItemWidth(local_12c * 12.0);
        bVar4 = ColorPicker4("##picker",col_00,uVar5 | 0x740080,&(pIVar19->ColorPickerRef).x);
        bVar20 = (bool)(bVar20 | bVar4);
        EndPopup();
      }
    }
    else {
      local_148 = (ImGuiWindow *)0x0;
    }
    if ((local_f0 != pcVar12) && ((uVar14 & 0x80) == 0)) {
      if ((uVar14 & 0x20) == 0) {
        local_c8 = ZEXT416((uint)(local_128 + (pIVar19->Style).ItemInnerSpacing.x));
      }
      IVar21.x = local_a8.x + (float)local_c8._0_4_;
      IVar21.y = local_a8.y + (pIVar19->Style).FramePadding.y;
      (local_e8->DC).CursorPos = IVar21;
      TextEx(pcVar12,local_f0,0);
    }
    if ((bVar20 != false) && (local_148 == (ImGuiWindow *)0x0)) {
      if ((local_138 & 1) == 0) {
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          local_158[lVar7] = (float)(int)(&local_118)[lVar7] / 255.0;
        }
      }
      if ((local_d4 & 0x8200000) == 0) {
        pIVar19->ColorEditLastHue = local_158[0];
        pIVar19->ColorEditLastSat = local_158[1];
        ColorConvertHSVtoRGB
                  ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                   local_158 + 1,local_158 + 2);
        buf._0_8_ = local_158._0_8_;
        buf._8_4_ = local_158[2];
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        IVar6 = ColorConvertFloat4ToU32((ImVec4 *)buf);
        pIVar19->ColorEditLastColor = IVar6;
      }
      if (local_d0 == 0x10100000) {
        ColorConvertRGBtoHSV
                  ((float)local_158._0_8_,SUB84(local_158._0_8_,4),local_158[2],local_158,
                   local_158 + 1,local_158 + 2);
      }
      *(undefined8 *)col_00 = local_158._0_8_;
      col_00[2] = local_158[2];
      if ((uVar14 & 2) == 0) {
        col_00[3] = local_158[3];
      }
    }
    PopID();
    EndGroup();
    if (((((pIVar19->LastItemData).StatusFlags & 1) != 0) && ((uVar14 & 0x200) == 0)) &&
       (bVar4 = BeginDragDropTarget(), bVar4)) {
      pIVar8 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar8 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar8->Data;
        col_00[2] = *(float *)(puVar2 + 1);
        *(undefined8 *)col_00 = *puVar2;
        bVar20 = true;
      }
      pIVar9 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar9 != (ImGuiPayload *)0x0) {
        memcpy(col_00,pIVar9->Data,(ulong)(uint)((int)local_90 << 2));
        bVar20 = true;
      }
      if ((pIVar9 != (ImGuiPayload *)0x0 || pIVar8 != (ImGuiPayload *)0x0) &&
          (uVar10 >> 0x1c & 1) != 0) {
        ColorConvertRGBtoHSV(*col_00,col_00[1],col_00[2],col_00,col_00 + 1,col_00 + 2);
      }
      EndDragDropTarget();
    }
    if (((local_148 != (ImGuiWindow *)0x0) && (pIVar19->ActiveId != 0)) &&
       (pIVar19->ActiveIdWindow == local_148)) {
      (pIVar19->LastItemData).ID = pIVar19->ActiveId;
    }
    if (bVar20 != false) {
      MarkItemEdited((pIVar19->LastItemData).ID);
    }
  }
  else {
    bVar20 = false;
  }
  return bVar20;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}